

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<float>::Decompose_LU(TPZMatrix<float> *this)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float nn;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  long local_50;
  float local_48;
  
  bVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar2) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar2 == 0) {
    local_50 = (this->super_TPZBaseMatrix).fRow;
    lVar5 = (this->super_TPZBaseMatrix).fCol;
    if (lVar5 < local_50) {
      local_50 = lVar5;
    }
    if (0 < local_50) {
      lVar5 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
        local_48 = extraout_XMM0_Da;
        if (ABS(extraout_XMM0_Da) < 1e-06) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar1 = lVar5 + 1;
        lVar3 = lVar1;
        if (lVar1 < (this->super_TPZBaseMatrix).fRow) {
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar5)
            ;
            local_60 = extraout_XMM0_Da_00 / local_48;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar3,lVar5,&local_60);
            lVar4 = lVar1;
            if (lVar1 < (this->super_TPZBaseMatrix).fCol) {
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar3,lVar4);
                local_5c = local_60;
                local_58 = extraout_XMM0_Da_01;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar4);
                local_54 = local_58 - extraout_XMM0_Da_02 * local_5c;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar3,lVar4,&local_54);
                lVar4 = lVar4 + 1;
              } while (lVar4 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar5 = lVar1;
      } while (lVar1 != local_50);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}